

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Deflate.h
# Opt level: O2

void __thiscall DeflateDecoder::DeflateDecoder(DeflateDecoder *this,string *message)

{
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,(string *)message);
  Cryptor::Cryptor(&this->super_Cryptor,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  (this->super_Cryptor)._vptr_Cryptor = (_func_int **)&PTR__Cryptor_0010acc8;
  return;
}

Assistant:

explicit DeflateDecoder(const std::string& message) : Cryptor(message) {}